

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall gvr::Mesh::resizeTriangleList(Mesh *this,int tn)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < tn) {
    uVar5 = (long)(tn * 3) << 2;
  }
  puVar2 = (uint *)operator_new__(uVar5);
  iVar4 = this->n;
  if (tn <= this->n) {
    iVar4 = tn;
  }
  if (0 < iVar4) {
    puVar1 = this->triangle;
    iVar3 = iVar4 * 3 + 1;
    uVar5 = (ulong)(iVar4 * 3 - 1);
    do {
      puVar2[uVar5] = puVar1[uVar5];
      iVar3 = iVar3 + -1;
      uVar5 = uVar5 - 1;
    } while (1 < iVar3);
  }
  if (this->triangle != (uint *)0x0) {
    operator_delete__(this->triangle);
  }
  this->triangle = puVar2;
  this->n = tn;
  return;
}

Assistant:

void Mesh::resizeTriangleList(int tn)
{
  unsigned int *p=new unsigned int [3*tn];

  for (int i=3*std::min(n, tn)-1; i>=0; i--)
  {
    p[i]=triangle[i];
  }

  delete [] triangle;

  triangle=p;
  n=tn;
}